

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O0

void __thiscall wasm::BinaryInstWriter::visitAtomicWait(BinaryInstWriter *this,AtomicWait *curr)

{
  BasicType BVar1;
  address64_t aVar2;
  AtomicWait *curr_local;
  BinaryInstWriter *this_local;
  
  BufferWithRandomAccess::operator<<(this->o,-2);
  BVar1 = wasm::Type::getBasic(&curr->expectedType);
  if (BVar1 == i32) {
    BufferWithRandomAccess::operator<<(this->o,'\x01');
    aVar2 = wasm::Address::operator_cast_to_unsigned_long(&curr->offset);
    emitMemoryAccess(this,4,4,aVar2,(Name)(curr->memory).super_IString.str);
  }
  else {
    if (BVar1 != i64) {
      handle_unreachable("unexpected type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                         ,0x22e);
    }
    BufferWithRandomAccess::operator<<(this->o,'\x02');
    aVar2 = wasm::Address::operator_cast_to_unsigned_long(&curr->offset);
    emitMemoryAccess(this,8,8,aVar2,(Name)(curr->memory).super_IString.str);
  }
  return;
}

Assistant:

void BinaryInstWriter::visitAtomicWait(AtomicWait* curr) {
  o << int8_t(BinaryConsts::AtomicPrefix);
  switch (curr->expectedType.getBasic()) {
    case Type::i32: {
      o << int8_t(BinaryConsts::I32AtomicWait);
      emitMemoryAccess(4, 4, curr->offset, curr->memory);
      break;
    }
    case Type::i64: {
      o << int8_t(BinaryConsts::I64AtomicWait);
      emitMemoryAccess(8, 8, curr->offset, curr->memory);
      break;
    }
    default:
      WASM_UNREACHABLE("unexpected type");
  }
}